

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

QPointer<QHttp2Stream> __thiscall
QHash<unsigned_int,_QPointer<QHttp2Stream>_>::value
          (QHash<unsigned_int,_QPointer<QHttp2Stream>_> *this,uint *key)

{
  Data *pDVar1;
  Node<unsigned_int,_QPointer<QHttp2Stream>_> *pNVar2;
  QObject *in_RDX;
  QObject *extraout_RDX;
  QPointer<QHttp2Stream> QVar3;
  
  if (*(Data<QHashPrivate::Node<unsigned_int,_QPointer<QHttp2Stream>_>_> **)key !=
      (Data<QHashPrivate::Node<unsigned_int,_QPointer<QHttp2Stream>_>_> *)0x0) {
    pNVar2 = QHashPrivate::Data<QHashPrivate::Node<unsigned_int,_QPointer<QHttp2Stream>_>_>::
             findNode<unsigned_int>
                       (*(Data<QHashPrivate::Node<unsigned_int,_QPointer<QHttp2Stream>_>_> **)key,
                        (uint *)in_RDX);
    in_RDX = extraout_RDX;
    if (pNVar2 != (Node<unsigned_int,_QPointer<QHttp2Stream>_> *)0x0) {
      pDVar1 = (Data *)(pNVar2->value).wp.d;
      this->d = pDVar1;
      this[1].d = (Data *)(pNVar2->value).wp.value;
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_001ed85e;
    }
  }
  this->d = (Data *)0x0;
  this[1].d = (Data *)0x0;
LAB_001ed85e:
  QVar3.wp.value = in_RDX;
  QVar3.wp.d = (Data *)this;
  return (QPointer<QHttp2Stream>)QVar3.wp;
}

Assistant:

T value(const Key &key) const noexcept
    {
        if (T *v = valueImpl(key))
            return *v;
        else
            return T();
    }